

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLUtil.cpp
# Opt level: O0

GLenum eglu::getImageGLTarget(EGLenum source)

{
  GLenum local_c;
  EGLenum source_local;
  
  switch(source) {
  case 0x30b1:
    local_c = 0xde1;
    break;
  case 0x30b2:
    local_c = 0x806f;
    break;
  case 0x30b3:
    local_c = 0x8515;
    break;
  case 0x30b4:
    local_c = 0x8516;
    break;
  case 0x30b5:
    local_c = 0x8517;
    break;
  case 0x30b6:
    local_c = 0x8518;
    break;
  case 0x30b7:
    local_c = 0x8519;
    break;
  case 0x30b8:
    local_c = 0x851a;
    break;
  case 0x30b9:
    local_c = 0x8d41;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

glw::GLenum getImageGLTarget (EGLenum source)
{
	switch (source)
	{
		case EGL_GL_TEXTURE_2D_KHR:						return GL_TEXTURE_2D;
		case EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_X_KHR:	return GL_TEXTURE_CUBE_MAP_POSITIVE_X;
		case EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_Y_KHR:	return GL_TEXTURE_CUBE_MAP_POSITIVE_Y;
		case EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_Z_KHR:	return GL_TEXTURE_CUBE_MAP_POSITIVE_Z;
		case EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_X_KHR:	return GL_TEXTURE_CUBE_MAP_NEGATIVE_X;
		case EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_Y_KHR:	return GL_TEXTURE_CUBE_MAP_NEGATIVE_Y;
		case EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_Z_KHR:	return GL_TEXTURE_CUBE_MAP_NEGATIVE_Z;
		case EGL_GL_TEXTURE_3D_KHR:						return GL_TEXTURE_3D;
		case EGL_GL_RENDERBUFFER_KHR:					return GL_RENDERBUFFER;
		default:	DE_FATAL("Impossible");				return GL_NONE;
	}
}